

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::is_empty(path *p)

{
  bool bVar1;
  uintmax_t uVar2;
  directory_iterator local_38;
  directory_iterator local_28;
  path *local_18;
  path *p_local;
  
  local_18 = p;
  bVar1 = is_directory(p);
  if (bVar1) {
    directory_iterator::directory_iterator(&local_28,local_18);
    directory_iterator::directory_iterator(&local_38);
    p_local._7_1_ = directory_iterator::operator==(&local_28,&local_38);
    directory_iterator::~directory_iterator(&local_38);
    directory_iterator::~directory_iterator(&local_28);
  }
  else {
    uVar2 = file_size(local_18);
    p_local._7_1_ = uVar2 == 0;
  }
  return (bool)(p_local._7_1_ & 1);
}

Assistant:

GHC_INLINE bool is_empty(const path& p)
{
    if (is_directory(p)) {
        return directory_iterator(p) == directory_iterator();
    }
    else {
        return file_size(p) == 0;
    }
}